

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_crypt_cfb8
              (mbedtls_aes_context *ctx,int mode,size_t length,uchar *iv,uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  undefined7 uStack_57;
  uchar ov [17];
  byte *pbStack_38;
  uchar c;
  uchar *output_local;
  uchar *input_local;
  uchar *iv_local;
  size_t length_local;
  int mode_local;
  mbedtls_aes_context *ctx_local;
  
  pbStack_38 = output;
  output_local = input;
  iv_local = (uchar *)length;
  while (iv_local != (uchar *)0x0) {
    uStack_57 = (undefined7)((ulong)*(undefined8 *)iv >> 8);
    ov[0] = (uchar)*(undefined8 *)(iv + 8);
    ov._1_7_ = (undefined7)((ulong)*(undefined8 *)(iv + 8) >> 8);
    mbedtls_aes_crypt_ecb(ctx,1,iv,iv);
    if (mode == 0) {
      ov[8] = *output_local;
    }
    bVar1 = *iv;
    bVar2 = *output_local;
    *pbStack_38 = bVar1 ^ bVar2;
    if (mode == 1) {
      ov[8] = bVar1 ^ bVar2;
    }
    *(ulong *)iv = CONCAT17(ov[0],uStack_57);
    *(ulong *)(iv + 8) = CONCAT17(ov[8],ov._1_7_);
    pbStack_38 = pbStack_38 + 1;
    output_local = output_local + 1;
    iv_local = iv_local + -1;
  }
  return 0;
}

Assistant:

int mbedtls_aes_crypt_cfb8( mbedtls_aes_context *ctx,
                       int mode,
                       size_t length,
                       unsigned char iv[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    unsigned char c;
    unsigned char ov[17];

    while( length-- )
    {
        memcpy( ov, iv, 16 );
        mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, iv, iv );

        if( mode == MBEDTLS_AES_DECRYPT )
            ov[16] = *input;

        c = *output++ = (unsigned char)( iv[0] ^ *input++ );

        if( mode == MBEDTLS_AES_ENCRYPT )
            ov[16] = c;

        memcpy( iv, ov + 1, 16 );
    }

    return( 0 );
}